

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.cpp
# Opt level: O3

size_t coda_urlenc(char *dst,char *src,size_t sz_src)

{
  byte bVar1;
  byte *pbVar2;
  uchar *psrc;
  uchar *pdst;
  byte *pbVar3;
  byte *pbVar4;
  
  pbVar4 = (byte *)dst;
  if (0 < (long)sz_src) {
    pbVar2 = (byte *)(src + sz_src);
    pbVar3 = (byte *)dst;
    do {
      bVar1 = *src;
      if ((table_urlenc[bVar1 >> 5] >> (bVar1 & 0x1f) & 1) == 0) {
        pbVar4 = pbVar3 + 1;
        if (bVar1 == 0x20) {
          *pbVar3 = 0x2b;
        }
        else {
          *pbVar3 = bVar1;
        }
      }
      else {
        *pbVar3 = 0x25;
        pbVar3[1] = "0123456789ABCDEF"[(byte)*src >> 4];
        pbVar3[2] = "0123456789ABCDEF"[(byte)*src & 0xf];
        pbVar4 = pbVar3 + 3;
      }
      src = (char *)((byte *)src + 1);
      pbVar3 = pbVar4;
    } while (src < pbVar2);
  }
  *pbVar4 = 0;
  return (long)pbVar4 - (long)dst;
}

Assistant:

size_t coda_urlenc(char* dst, const char* src, size_t sz_src)
{
	unsigned char* pdst = (unsigned char *) dst;
	unsigned char* psrc = (unsigned char *) src;
	unsigned char* esrc = (unsigned char *) src + sz_src;

	while (psrc < esrc)
	{
		if (table_urlenc[*psrc >> 5] & (1 << (*psrc & 0x1f)))
		{
			*pdst++ = '%';
			*pdst++ = table_hexval[*psrc >> 4];
			*pdst++ = table_hexval[*psrc & 0xf];
			++psrc;
		}
		else if (*psrc == ' ')
		{
			*pdst++ = '+';
			++psrc;
		}
		else
		{
			*pdst++ = *psrc++;
		}
	}

	*pdst = 0;

	return pdst - (unsigned char *) dst;
}